

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O2

level_enum spdlog::level::from_str(string *name)

{
  basic_string_view<char> rhs;
  bool bVar1;
  level_enum lVar2;
  long lVar3;
  
  lVar2 = trace;
  lVar3 = 8;
  while( true ) {
    if (lVar3 == 0x78) {
      bVar1 = std::operator==(name,"warn");
      if (bVar1) {
        lVar2 = warn;
      }
      else {
        bVar1 = std::operator==(name,"err");
        lVar2 = (uint)!bVar1 * 2 + err;
      }
      return lVar2;
    }
    rhs.data_ = (name->_M_dataplus)._M_p;
    rhs.size_ = name->_M_string_length;
    bVar1 = fmt::v6::operator==(*(basic_string_view<char> *)
                                 (&testing::internal::TypeIdHelper<testing::Test>::dummy_ + lVar3),
                                rhs);
    if (bVar1) break;
    lVar2 = lVar2 + debug;
    lVar3 = lVar3 + 0x10;
  }
  return lVar2;
}

Assistant:

SPDLOG_INLINE spdlog::level::level_enum from_str(const std::string &name) SPDLOG_NOEXCEPT
{
    int level = 0;
    for (const auto &level_str : level_string_views)
    {
        if (level_str == name)
        {
            return static_cast<level::level_enum>(level);
        }
        level++;
    }
    // check also for "warn" and "err" before giving up..
    if (name == "warn")
    {
        return level::warn;
    }
    if (name == "err")
    {
        return level::err;
    }
    return level::off;
}